

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int Extra_bddCountCubes(DdManager *dd,DdNode **pFuncs,int nFuncs,int fMode,int nLimit,int *pGuide)

{
  uint uVar1;
  int iVar2;
  st__table *table;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int *piVar5;
  DdNode *L;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar11;
  int Count1;
  int Count0;
  int local_6c;
  int local_68;
  uint local_64;
  ulong local_60;
  int *local_58;
  DdManager *local_50;
  st__table *local_48;
  int local_3c;
  ulong local_38;
  ulong uVar10;
  
  uVar6 = (ulong)(uint)fMode;
  local_58 = pGuide;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  uVar1 = dd->maxLive;
  dd->maxLive = (dd->keys - dd->dead) + 1000000;
  local_3c = nFuncs;
  if (nFuncs < 1) {
    iVar8 = 0;
    iVar7 = 0;
  }
  else {
    local_38 = (ulong)(uint)nFuncs;
    local_64 = fMode + 1;
    uVar9 = 0;
    iVar7 = 0;
    local_60 = uVar6;
    local_50 = dd;
    local_48 = table;
    do {
      pDVar4 = pFuncs[uVar9];
      if (pDVar4 != (DdNode *)0x0) {
        uVar10 = uVar9;
        local_6c = nLimit;
        local_68 = nLimit;
        if (((int)uVar6 == 1) || ((int)uVar6 == -1)) {
          pDVar3 = extraBddCountCubes(local_50,pDVar4,pDVar4,table,&local_6c,nLimit);
          bVar11 = pDVar3 != (DdNode *)0x0;
          pDVar4 = pFuncs[uVar9];
          L = (DdNode *)((ulong)pDVar4 ^ 1);
          pFuncs[uVar9] = L;
          table = local_48;
          dd = local_50;
          if (local_64 < 2) goto LAB_007b8251;
          pFuncs[uVar9] = pDVar4;
          if (pDVar3 == (DdNode *)0x0) break;
LAB_007b82a4:
          local_58[uVar9] = 1;
          piVar5 = &local_6c;
        }
        else {
          L = (DdNode *)((ulong)pDVar4 ^ 1);
          pFuncs[uVar9] = L;
          if (1 < local_64) {
            pFuncs[uVar9] = pDVar4;
            break;
          }
          bVar11 = false;
LAB_007b8251:
          iVar8 = local_6c;
          pDVar4 = extraBddCountCubes(dd,L,L,table,&local_68,local_6c);
          *(byte *)(pFuncs + uVar9) = *(byte *)(pFuncs + uVar9) ^ 1;
          if ((!bVar11) && (table = local_48, dd = local_50, pDVar4 == (DdNode *)0x0)) break;
          if ((pDVar4 == (DdNode *)0x0) || ((bVar11 && (iVar8 <= local_68)))) goto LAB_007b82a4;
          local_58[uVar9] = 0;
          piVar5 = &local_68;
        }
        iVar7 = iVar7 + *piVar5;
        table = local_48;
        dd = local_50;
        uVar6 = local_60;
      }
      uVar9 = uVar9 + 1;
      uVar10 = local_38;
    } while (local_38 != uVar9);
    iVar8 = (int)uVar10;
  }
  dd->maxLive = uVar1;
  st__free_table(table);
  iVar2 = -1;
  if (iVar8 == local_3c) {
    iVar2 = iVar7;
  }
  return iVar2;
}

Assistant:

int Extra_bddCountCubes( DdManager * dd, DdNode ** pFuncs, int nFuncs, int fMode, int nLimit, int * pGuide )
{
    DdNode * pF0, * pF1; 
    int i, Count, Count0, Count1, CounterAll = 0;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash );
    unsigned int saveLimit = dd->maxLive;
    dd->maxLive = dd->keys - dd->dead + 1000000; // limit on intermediate BDD nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        if ( !pFuncs[i] )
            continue;
        pF1 = pF0 = NULL;
        Count0 = Count1 = nLimit;
        if ( fMode == -1 || fMode == 1 ) // both or pos
            pF1 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count1, nLimit );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( fMode == -1 || fMode == 0 ) // both or neg
            pF0 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count0, Count1 );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( !pF1 && !pF0 )
            break;
        if ( !pF0 )                  pGuide[i] = 1, Count = Count1; // use pos
        else if ( !pF1 )             pGuide[i] = 0, Count = Count0; // use neg
        else if ( Count1 <= Count0 ) pGuide[i] = 1, Count = Count1; // use pos
        else                         pGuide[i] = 0, Count = Count0; // use neg
        CounterAll += Count;
        //printf( "Output %5d has %5d cubes (%d)  (%5d and %5d)\n", nOuts++, Count, pGuide[i], Count1, Count0 );
    }
    dd->maxLive = saveLimit;
    st__free_table( table );
    return i == nFuncs ? CounterAll : -1;
}